

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O3

ostream * cppqc::printInput<std::vector<int,std::allocator<int>>>
                    (ostream *out,tuple<std::vector<int,_std::allocator<int>_>_> *in)

{
  ostream *poVar1;
  vector<int,_std::allocator<int>_> *x;
  char local_39;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"  0: ",5);
  PrettyPrint<std::vector<int,std::allocator<int>>>::toString_abi_cxx11_
            (&local_38,(PrettyPrint<std::vector<int,std::allocator<int>>> *)in,x);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_38._M_dataplus._M_p,local_38._M_string_length);
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_39,1);
  poVar1 = (ostream *)std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return poVar1;
}

Assistant:

std::ostream& printInput(std::ostream& out, const std::tuple<T0>& in) {
  return out << "  0: " << prettyPrint(std::get<0>(in)) << '\n' << std::flush;
}